

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O1

MVECTOR<float> * CCEXP::getRow<float>(CCEXP *obj,char *matname,size_t row)

{
  int iVar1;
  size_t sVar2;
  uint line;
  char *msg;
  MVECTOR<float> *local_20;
  
  obj->ErrorId = 0;
  sVar2 = CCEXP::getTableIndexByName(obj,matname);
  if (sVar2 == 0xffffffffffffffff) {
    msg = "[%s]: getRow():: Failed to find table with name [%s]!";
    line = 0x33d;
  }
  else {
    obj->ErrorId = 0;
    if (obj->isActive != true) {
      return (MVECTOR<float> *)0x0;
    }
    if (obj->Status == 1) {
      obj->Status = 2;
      if (sVar2 < (obj->M).elements) {
        iVar1 = CCEXPMat<float>::getRow
                          ((CCEXPMat<float> *)
                           (obj->M).pdata[sVar2].
                           super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           row,&local_20);
        if (iVar1 == 0) {
          obj->Status = 1;
          return local_20;
        }
        msg = "[%s]: getRow():: Internal error occured during getRow()";
        line = 0x331;
      }
      else {
        obj->Status = 1;
        msg = "[%s]: getRow():: Failed to find table with ID [%zu]!";
        line = 0x336;
      }
    }
    else {
      msg = "[%s]: getRow():: CCEXP object with filename [%s] has wrong status.";
      line = 0x32b;
    }
  }
  CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",line,msg,obj->SavingFile);
  return (MVECTOR<float> *)0x0;
}

Assistant:

inline MVECTOR<T>* getRow(
	CCEXP &obj, const char* matname, size_t row
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERRN(CCEXPECS,sel == MAXSIZE_T,"[%s]: getRow():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	MVECTOR<T>* vret = getRow<T>(obj, sel, row);
	return vret;
}